

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathtypes.h
# Opt level: O1

mat4 * __thiscall rengine::mat4::inverted(mat4 *__return_storage_ptr__,mat4 *this,bool *invertible)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  int i;
  long lVar16;
  float *pfVar17;
  mat4 *pmVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float afStack_118 [2];
  mat4 inv;
  
  inv.m[0xe] = 0.0;
  fVar19 = this->m[10];
  fVar1 = this->m[5];
  fVar2 = this->m[6];
  fVar3 = this->m[0xf];
  fVar4 = this->m[0xb];
  fVar5 = this->m[0xe];
  fVar6 = this->m[9];
  fVar7 = this->m[7];
  fVar8 = this->m[0xd];
  afStack_118[0] =
       (fVar2 * fVar8 * fVar4 +
       fVar6 * fVar7 * fVar5 +
       ((fVar1 * fVar19 * fVar3 - fVar4 * fVar1 * fVar5) - fVar2 * fVar6 * fVar3)) -
       fVar7 * fVar8 * fVar19;
  fVar9 = this->m[4];
  fVar10 = this->m[8];
  fVar11 = this->m[0xc];
  inv.m[2] = fVar7 * fVar11 * fVar19 +
             (((fVar2 * fVar10 * fVar3 + (fVar5 * fVar4 * fVar9 - fVar19 * fVar9 * fVar3)) -
              fVar7 * fVar10 * fVar5) - fVar2 * fVar11 * fVar4);
  inv.m[6] = (fVar1 * fVar11 * fVar4 +
             fVar7 * fVar10 * fVar8 +
             ((fVar6 * fVar9 * fVar3 - fVar4 * fVar9 * fVar8) - fVar1 * fVar10 * fVar3)) -
             fVar7 * fVar11 * fVar6;
  inv.m[10] = fVar2 * fVar11 * fVar6 +
              (((fVar1 * fVar10 * fVar5 + (fVar19 * fVar9 * fVar8 - fVar6 * fVar9 * fVar5)) -
               fVar2 * fVar10 * fVar8) - fVar1 * fVar11 * fVar19);
  fVar12 = this->m[1];
  fVar13 = this->m[2];
  fVar14 = this->m[3];
  afStack_118[1] =
       fVar8 * fVar14 * fVar19 +
       (((fVar6 * fVar13 * fVar3 + (fVar4 * fVar12 * fVar5 - fVar19 * fVar12 * fVar3)) -
        fVar6 * fVar14 * fVar5) - fVar8 * fVar13 * fVar4);
  fVar15 = this->m[0];
  fVar21 = -fVar9;
  fVar20 = -fVar10;
  fVar23 = -fVar11;
  inv.m[3] = fVar14 * fVar23 * fVar19 +
             fVar11 * fVar13 * fVar4 +
             fVar10 * fVar14 * fVar5 +
             fVar13 * fVar20 * fVar3 + (fVar19 * fVar15 * fVar3 - fVar5 * fVar4 * fVar15);
  fVar22 = -fVar15;
  inv.m[7] = fVar11 * fVar14 * fVar6 +
             fVar12 * fVar23 * fVar4 +
             fVar14 * fVar20 * fVar8 +
             fVar10 * fVar12 * fVar3 + (fVar4 * fVar15 * fVar8 - fVar6 * fVar15 * fVar3);
  inv.m[0xb] = fVar23 * fVar13 * fVar6 +
               fVar11 * fVar12 * fVar19 +
               fVar10 * fVar13 * fVar8 +
               fVar20 * fVar12 * fVar5 + (fVar6 * fVar15 * fVar5 - fVar19 * fVar15 * fVar8);
  inv.m[1] = fVar6 * fVar14 * fVar2 +
             (((fVar1 * fVar13 * fVar4 + (fVar7 * fVar12 * fVar19 - fVar2 * fVar12 * fVar4)) -
              fVar1 * fVar14 * fVar19) - fVar6 * fVar13 * fVar7);
  inv.m[0] = (fVar8 * fVar13 * fVar7 +
             fVar1 * fVar14 * fVar5 +
             ((fVar2 * fVar12 * fVar3 - fVar5 * fVar7 * fVar12) - fVar1 * fVar13 * fVar3)) -
             fVar8 * fVar14 * fVar2;
  inv.m[5] = fVar14 * fVar20 * fVar2 +
             fVar10 * fVar13 * fVar7 +
             fVar9 * fVar14 * fVar19 +
             fVar21 * fVar13 * fVar4 + fVar2 * fVar15 * fVar4 + fVar7 * fVar22 * fVar19;
  inv.m[4] = fVar11 * fVar14 * fVar2 +
             fVar23 * fVar13 * fVar7 +
             fVar14 * fVar21 * fVar5 +
             fVar9 * fVar13 * fVar3 + fVar2 * fVar22 * fVar3 + fVar5 * fVar7 * fVar15;
  inv.m[9] = fVar10 * fVar14 * fVar1 +
             fVar20 * fVar12 * fVar7 +
             fVar14 * fVar21 * fVar6 +
             fVar9 * fVar12 * fVar4 + fVar22 * fVar1 * fVar4 + fVar7 * fVar15 * fVar6;
  inv.m[8] = fVar14 * fVar23 * fVar1 +
             fVar11 * fVar12 * fVar7 +
             fVar9 * fVar14 * fVar8 +
             fVar3 * fVar12 * fVar21 + fVar1 * fVar15 * fVar3 + fVar8 * fVar7 * fVar22;
  inv.m[0xd] = fVar13 * fVar20 * fVar1 +
               fVar10 * fVar12 * fVar2 +
               fVar9 * fVar13 * fVar6 +
               fVar12 * fVar21 * fVar19 + fVar1 * fVar15 * fVar19 + fVar2 * fVar22 * fVar6;
  inv.m[0xc] = fVar11 * fVar13 * fVar1 +
               fVar12 * fVar23 * fVar2 +
               fVar8 * fVar21 * fVar13 +
               fVar5 * fVar9 * fVar12 + fVar22 * fVar1 * fVar5 + fVar8 * fVar2 * fVar15;
  fVar19 = inv.m[10] * fVar14 + inv.m[6] * fVar13 + afStack_118[0] * fVar15 + inv.m[2] * fVar12;
  if ((fVar19 != 0.0) || (NAN(fVar19))) {
    lVar16 = 0;
    do {
      afStack_118[lVar16] = afStack_118[lVar16] * (1.0 / fVar19);
      lVar16 = lVar16 + 1;
    } while (lVar16 != 0x10);
    if (invertible != (bool *)0x0) {
      *invertible = true;
    }
    pfVar17 = afStack_118;
    pmVar18 = __return_storage_ptr__;
    for (lVar16 = 0x11; lVar16 != 0; lVar16 = lVar16 + -1) {
      pmVar18->m[0] = *pfVar17;
      pfVar17 = pfVar17 + 1;
      pmVar18 = (mat4 *)(pmVar18->m + 1);
    }
  }
  else {
    if (invertible != (bool *)0x0) {
      *invertible = false;
    }
    __return_storage_ptr__->m[0xc] = 0.0;
    __return_storage_ptr__->m[0xd] = 0.0;
    __return_storage_ptr__->m[0xe] = 0.0;
    __return_storage_ptr__->m[0xf] = 1.0;
    __return_storage_ptr__->m[8] = 0.0;
    __return_storage_ptr__->m[9] = 0.0;
    __return_storage_ptr__->m[10] = 1.0;
    __return_storage_ptr__->m[0xb] = 0.0;
    __return_storage_ptr__->m[4] = 0.0;
    __return_storage_ptr__->m[5] = 1.0;
    __return_storage_ptr__->m[6] = 0.0;
    __return_storage_ptr__->m[7] = 0.0;
    __return_storage_ptr__->m[0] = 1.0;
    __return_storage_ptr__->m[1] = 0.0;
    __return_storage_ptr__->m[2] = 0.0;
    __return_storage_ptr__->m[3] = 0.0;
    __return_storage_ptr__->type = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

mat4 inverted(bool *invertible) const {
        mat4 inv;
        inv.m[0] = m[5]  * m[10] * m[15] -
                   m[5]  * m[11] * m[14] -
                   m[9]  * m[6]  * m[15] +
                   m[9]  * m[7]  * m[14] +
                   m[13] * m[6]  * m[11] -
                   m[13] * m[7]  * m[10];
        inv.m[4] = -m[4]  * m[10] * m[15] +
                    m[4]  * m[11] * m[14] +
                    m[8]  * m[6]  * m[15] -
                    m[8]  * m[7]  * m[14] -
                    m[12] * m[6]  * m[11] +
                    m[12] * m[7]  * m[10];
        inv.m[8] = m[4]  * m[9] * m[15] -
                   m[4]  * m[11] * m[13] -
                   m[8]  * m[5] * m[15] +
                   m[8]  * m[7] * m[13] +
                   m[12] * m[5] * m[11] -
                   m[12] * m[7] * m[9];
        inv.m[12] = -m[4]  * m[9] * m[14] +
                     m[4]  * m[10] * m[13] +
                     m[8]  * m[5] * m[14] -
                     m[8]  * m[6] * m[13] -
                     m[12] * m[5] * m[10] +
                     m[12] * m[6] * m[9];
        inv.m[1] = -m[1]  * m[10] * m[15] +
                    m[1]  * m[11] * m[14] +
                    m[9]  * m[2] * m[15] -
                    m[9]  * m[3] * m[14] -
                    m[13] * m[2] * m[11] +
                    m[13] * m[3] * m[10];
        inv.m[5] = m[0]  * m[10] * m[15] -
                   m[0]  * m[11] * m[14] -
                   m[8]  * m[2] * m[15] +
                   m[8]  * m[3] * m[14] +
                   m[12] * m[2] * m[11] -
                   m[12] * m[3] * m[10];
        inv.m[9] = -m[0]  * m[9] * m[15] +
                    m[0]  * m[11] * m[13] +
                    m[8]  * m[1] * m[15] -
                    m[8]  * m[3] * m[13] -
                    m[12] * m[1] * m[11] +
                    m[12] * m[3] * m[9];
        inv.m[13] = m[0]  * m[9] * m[14] -
                    m[0]  * m[10] * m[13] -
                    m[8]  * m[1] * m[14] +
                    m[8]  * m[2] * m[13] +
                    m[12] * m[1] * m[10] -
                    m[12] * m[2] * m[9];
        inv.m[2] = m[1]  * m[6] * m[15] -
                    m[1]  * m[7] * m[14] -
                    m[5]  * m[2] * m[15] +
                    m[5]  * m[3] * m[14] +
                    m[13] * m[2] * m[7] -
                    m[13] * m[3] * m[6];
        inv.m[6] = -m[0]  * m[6] * m[15] +
                    m[0]  * m[7] * m[14] +
                    m[4]  * m[2] * m[15] -
                    m[4]  * m[3] * m[14] -
                    m[12] * m[2] * m[7] +
                    m[12] * m[3] * m[6];
        inv.m[10] = m[0]  * m[5] * m[15] -
                    m[0]  * m[7] * m[13] -
                    m[4]  * m[1] * m[15] +
                    m[4]  * m[3] * m[13] +
                    m[12] * m[1] * m[7] -
                    m[12] * m[3] * m[5];
        inv.m[14] = -m[0]  * m[5] * m[14] +
                     m[0]  * m[6] * m[13] +
                     m[4]  * m[1] * m[14] -
                     m[4]  * m[2] * m[13] -
                     m[12] * m[1] * m[6] +
                     m[12] * m[2] * m[5];
        inv.m[3] = -m[1] * m[6] * m[11] +
                    m[1] * m[7] * m[10] +
                    m[5] * m[2] * m[11] -
                    m[5] * m[3] * m[10] -
                    m[9] * m[2] * m[7] +
                    m[9] * m[3] * m[6];
        inv.m[7] = m[0] * m[6] * m[11] -
                   m[0] * m[7] * m[10] -
                   m[4] * m[2] * m[11] +
                   m[4] * m[3] * m[10] +
                   m[8] * m[2] * m[7] -
                   m[8] * m[3] * m[6];
        inv.m[11] = -m[0] * m[5] * m[11] +
                     m[0] * m[7] * m[9] +
                     m[4] * m[1] * m[11] -
                     m[4] * m[3] * m[9] -
                     m[8] * m[1] * m[7] +
                     m[8] * m[3] * m[5];
        inv.m[15] = m[0] * m[5] * m[10] -
                    m[0] * m[6] * m[9] -
                    m[4] * m[1] * m[10] +
                    m[4] * m[2] * m[9] +
                    m[8] * m[1] * m[6] -
                    m[8] * m[2] * m[5];

        float det = m[0] * inv.m[0] + m[1] * inv.m[4] + m[2] * inv.m[8] + m[3] * inv.m[12];

        if (det == 0) {
            if (invertible)
                *invertible = false;
            return mat4();
        }

        det = 1.0 / det;
        for (int i = 0; i < 16; i++)
            inv.m[i] *= det;

        if (invertible)
            *invertible = true;

        return inv;
    }